

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O3

void __thiscall SplitFlow::replacePiece(SplitFlow *this,ReplaceOp *rop)

{
  PcodeOp *op;
  pointer ppVVar1;
  Varnode *vn;
  Varnode *vn_00;
  
  op = rop->op;
  ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  vn = *ppVVar1;
  vn_00 = ppVVar1[1];
  Funcdata::opUnsetInput(this->fd,op,0);
  Funcdata::opUnsetInput(this->fd,op,1);
  Funcdata::opSetInput(this->fd,rop->loOp,vn_00,0);
  Funcdata::opSetInput(this->fd,rop->hiOp,vn,0);
  Funcdata::opInsertBefore(this->fd,rop->loOp,op);
  Funcdata::opInsertBefore(this->fd,rop->hiOp,op);
  rop->doDelete = true;
  return;
}

Assistant:

void SplitFlow::replacePiece(ReplaceOp *rop)

{ // Finish replacing the CPUI_PIECE operation with two COPY operations
  PcodeOp *op = rop->op;
  Varnode *invn0 = op->getIn(0);
  Varnode *invn1 = op->getIn(1);
  fd->opUnsetInput(op,0);
  fd->opUnsetInput(op,1);
  fd->opSetInput(rop->loOp,invn1,0);
  fd->opSetInput(rop->hiOp,invn0,0);
  fd->opInsertBefore(rop->loOp,op);	// insert at the same place as original op
  fd->opInsertBefore(rop->hiOp,op);
  rop->doDelete = true;		// Mark this op to be deleted
}